

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O0

void __thiscall helics::apps::Echo::echoMessage(Echo *this,Endpoint *ept,Time currentTime)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *in_RDI;
  __sv_type _Var2;
  lock_guard<std::mutex> lock;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> m;
  mutex_type *in_stack_ffffffffffffff68;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *puVar3;
  lock_guard<std::mutex> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Endpoint *in_stack_ffffffffffffff78;
  Endpoint *this_01;
  SmallBuffer *in_stack_ffffffffffffff88;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffff90;
  string_view in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_18 = in_RSI;
  Endpoint::getMessage(in_stack_ffffffffffffff78);
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                       0x405d02);
    if (!bVar1) break;
    puVar3 = (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
             &stack0xffffffffffffffe0;
    this_00 = local_18;
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x405d26);
    this_01 = (Endpoint *)&stack0xffffffffffffffa8;
    data_view::data_view
              ((data_view *)in_stack_ffffffffffffff90.internalTimeCode,in_stack_ffffffffffffff88);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x405d45);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
    in_stack_ffffffffffffff90 =
         TimeRepresentation<count_time<9,_long>_>::operator+
                   ((TimeRepresentation<count_time<9,_long>_> *)this_01,
                    (TimeRepresentation<count_time<9,_long>_> *)this_00);
    Endpoint::sendToAt((Endpoint *)_Var2._M_len,
                       (data_view *)in_stack_ffffffffffffff90.internalTimeCode,
                       in_stack_ffffffffffffffa8,(Time)_Var2._M_str);
    data_view::~data_view((data_view *)0x405da6);
    Endpoint::getMessage(this_01);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator=
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)this_00,puVar3)
    ;
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr(in_RDI);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x405e1c);
  std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr(in_RDI);
  return;
}

Assistant:

void Echo::echoMessage(const Endpoint& ept, Time currentTime)
    {
        auto m = ept.getMessage();
        std::lock_guard<std::mutex> lock(delayTimeLock);
        while (m) {
            ept.sendToAt(m->data, m->original_source, currentTime + delayTime);
            m = ept.getMessage();
        }
    }